

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O2

void radio_draw_io(t_radio *x,_glist *glist,int old_snd_rcv_flags)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  _glist *p_Var5;
  int iVar6;
  uint uVar7;
  char *tags [2];
  char tag [128];
  char tag_but [128];
  char tag_object [128];
  
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  uVar2 = text_xpix((t_text *)x,glist);
  uVar3 = text_ypix((t_text *)x,glist);
  uVar4 = iVar1 * 7;
  p_Var5 = glist_getcanvas((_glist *)(ulong)uVar4);
  tags[0] = tag_object;
  tags[1] = tag;
  sprintf(tags[0],"%lxOBJ",x);
  sprintf(tag_but,"%lxBUT",x);
  sprintf(tag,"%lxOUT%d",x,0);
  pdgui_vmess((char *)0x0,"crs",p_Var5,"delete",tag);
  if (((uint)(x->x_gui).x_fsf & 0x80) == 0) {
    if (x->x_orientation == horizontal) {
      iVar6 = 1;
    }
    else {
      iVar6 = x->x_number;
    }
    uVar7 = iVar6 * (x->x_gui).x_h + uVar3;
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var5,"create","rectangle",(ulong)uVar2,
                (ulong)(uVar7 + iVar1 * -2),(ulong)(uVar4 + uVar2),(ulong)uVar7,"-fill","black",
                "-tags",2,tags);
    pdgui_vmess((char *)0x0,"crss",p_Var5,"lower",tag,tag_but);
  }
  sprintf(tag,"%lxIN%d",x,0);
  pdgui_vmess((char *)0x0,"crs",p_Var5,"delete",tag);
  if (((uint)(x->x_gui).x_fsf & 0x40) == 0) {
    pdgui_vmess((char *)0x0,"crr iiii rs rS",p_Var5,"create","rectangle",(ulong)uVar2,(ulong)uVar3,
                (ulong)(uVar2 + uVar4),(ulong)(uVar3 + iVar1 * 2),"-fill","black","-tags",2,tags);
    pdgui_vmess((char *)0x0,"crss",p_Var5,"lower",tag,tag_but);
  }
  return;
}

Assistant:

static void radio_draw_io(t_radio* x, t_glist* glist, int old_snd_rcv_flags)
{
    const int zoom = IEMGUI_ZOOM(x);
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int iow = IOWIDTH * zoom, ioh = IEM_GUI_IOHEIGHT * zoom;
    t_canvas *canvas = glist_getcanvas(glist);
    char tag_object[128], tag_but[128], tag[128];
    char *tags[] = {tag_object, tag};

    (void)old_snd_rcv_flags;

    sprintf(tag_object, "%lxOBJ", x);
    sprintf(tag_but, "%lxBUT", x);

    sprintf(tag, "%lxOUT%d", x, 0);
    pdgui_vmess(0, "crs", canvas, "delete", tag);
    if(!x->x_gui.x_fsf.x_snd_able)
    {
        int height = x->x_gui.x_h * ((x->x_orientation == horizontal)? 1: x->x_number);
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos, ypos + height + zoom - ioh,
            xpos + iow, ypos + height,
            "-fill", "black",
            "-tags", 2, tags);

            /* keep buttons above outlet */
        pdgui_vmess(0, "crss", canvas, "lower", tag, tag_but);
    }

    sprintf(tag, "%lxIN%d", x, 0);
    pdgui_vmess(0, "crs", canvas, "delete", tag);
    if(!x->x_gui.x_fsf.x_rcv_able)
    {
        pdgui_vmess(0, "crr iiii rs rS", canvas, "create", "rectangle",
            xpos, ypos,
            xpos + iow, ypos - zoom + ioh,
            "-fill", "black",
            "-tags", 2, tags);

            /* keep buttons above inlet */
        pdgui_vmess(0, "crss", canvas, "lower", tag, tag_but);
    }
}